

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::erase
          (Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this,Bucket bucket)

{
  byte bVar1;
  Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *pSVar2;
  long lVar3;
  size_t bucket_00;
  ulong uVar4;
  Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this_00;
  Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *pSVar5;
  Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *pSVar6;
  Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this_01;
  size_t sVar7;
  size_t fromIndex;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::erase(this_00,bucket_00);
  this->size = this->size - 1;
  this_01 = this_00;
  fromIndex = bucket_00;
  do {
    pSVar2 = this->spans;
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      this_00 = this_00 + 1;
      if (((long)this_00 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
      {
        this_00 = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = this_00->offsets[fromIndex];
    if ((ulong)bVar1 != 0xff) {
      lVar3 = *(long *)(this_00->entries[bVar1].storage.data + 0x10);
      if (lVar3 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)*(int *)(lVar3 + 0x1c);
      }
      uVar4 = uVar4 ^ this->seed;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
      uVar4 = this->numBuckets - 1 & (uVar4 >> 0x20 ^ uVar4);
      pSVar5 = pSVar2 + (uVar4 >> 7);
      sVar7 = (size_t)((uint)uVar4 & 0x7f);
      if (sVar7 != fromIndex || pSVar5 != this_00) {
        do {
          if ((pSVar5 == this_01) && (sVar7 == bucket_00)) {
            if (this_00 == this_01) {
              this_01->offsets[bucket_00] = this_01->offsets[fromIndex];
              this_01->offsets[fromIndex] = 0xff;
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            else {
              Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::moveFromSpan
                        (this_01,this_00,fromIndex,bucket_00);
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            break;
          }
          sVar7 = sVar7 + 1;
          if (sVar7 == 0x80) {
            pSVar6 = pSVar5 + 1;
            pSVar5 = pSVar2;
            if (((long)pSVar6 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
                != 0) {
              pSVar5 = pSVar6;
            }
            sVar7 = 0;
          }
        } while ((pSVar5 != this_00) || (sVar7 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }